

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferInputSource.cc
# Opt level: O0

ssize_t __thiscall
BufferInputSource::read(BufferInputSource *this,int __fd,void *__buf,size_t __nbytes)

{
  size_t __dest;
  logic_error *this_00;
  unsigned_long *puVar1;
  uchar *puVar2;
  qpdf_offset_t qVar3;
  undefined4 in_register_00000034;
  long local_58;
  size_t local_50;
  BufferInputSource *local_48;
  size_t len;
  qpdf_offset_t end_pos;
  void *local_28;
  size_t length_local;
  char *buffer_local;
  BufferInputSource *this_local;
  
  length_local = CONCAT44(in_register_00000034,__fd);
  local_28 = __buf;
  buffer_local = (char *)this;
  if (this->cur_offset < 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"INTERNAL ERROR: BufferInputSource offset < 0");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  len = this->max_offset;
  if (this->cur_offset < (long)len) {
    (this->super_InputSource).last_offset = this->cur_offset;
    local_58 = len - this->cur_offset;
    local_50 = QIntC::to_size<long_long>(&local_58);
    puVar1 = std::min<unsigned_long>(&local_50,(unsigned_long *)&local_28);
    __dest = length_local;
    local_48 = (BufferInputSource *)*puVar1;
    puVar2 = Buffer::getBuffer(this->buf);
    memcpy((void *)__dest,puVar2 + this->cur_offset,(size_t)local_48);
    qVar3 = QIntC::to_offset<unsigned_long>((unsigned_long *)&local_48);
    this->cur_offset = qVar3 + this->cur_offset;
    this_local = local_48;
  }
  else {
    (this->super_InputSource).last_offset = len;
    this_local = (BufferInputSource *)0x0;
  }
  return (ssize_t)this_local;
}

Assistant:

size_t
BufferInputSource::read(char* buffer, size_t length)
{
    if (this->cur_offset < 0) {
        throw std::logic_error("INTERNAL ERROR: BufferInputSource offset < 0");
    }
    qpdf_offset_t end_pos = this->max_offset;
    if (this->cur_offset >= end_pos) {
        this->last_offset = end_pos;
        return 0;
    }

    this->last_offset = this->cur_offset;
    size_t len = std::min(QIntC::to_size(end_pos - this->cur_offset), length);
    memcpy(buffer, this->buf->getBuffer() + this->cur_offset, len);
    this->cur_offset += QIntC::to_offset(len);
    return len;
}